

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTab.cpp
# Opt level: O0

TypeDescriptor * __thiscall SymTab::getValueFor(SymTab *this,string *vName)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *ppTVar3;
  TypeDescriptor *value;
  string local_38;
  string *local_18;
  string *vName_local;
  SymTab *this_local;
  
  local_18 = vName;
  vName_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)vName);
  bVar1 = isDefined(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ppTVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeDescriptor_*>_>_>
              ::operator[](&this->symTab,vName);
    return *ppTVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"SymTab::getValueFor: ");
  poVar2 = std::operator<<(poVar2,(string *)vName);
  std::operator<<(poVar2," has not been defined.\n");
  exit(1);
}

Assistant:

TypeDescriptor *SymTab::getValueFor(std::string vName) {
    if( ! isDefined(vName)) {
        std::cout << "SymTab::getValueFor: " << vName << " has not been defined.\n";
        exit(1);
    }
    TypeDescriptor *value = symTab[vName];
//    if(value->type() == TypeDescriptor::NUMBER) {
//        double numValue = value->getNumber();
//        std::cout << "SymTab::getValueFor: " << vName << " contains " << numValue << std::endl;
//    } else if(value->type() == TypeDescriptor::BOOLEAN) {
//        if(value->getBoolean())
//            std::cout << "SymTab::getValueFor: " << vName << " contains true" << std::endl;
//        else{
//            std::cout << "SymTab::getValueFor: " << vName << " contains false" << std::endl;
//        }
//    }else{
//        std::string stringValue = value->getString();
//        std::cout << "SymTab::getValueFor: " << vName << " contains " << stringValue << std::endl;
//
//    }
    return value;

}